

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O3

bool __thiscall
deqp::egl::Image::GLES2ImageApi::RenderReadPixelsRenderbuffer::invokeGLES2
          (RenderReadPixelsRenderbuffer *this,GLES2ImageApi *api,
          MovePtr<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_> *img,
          Texture2D *reference)

{
  ostringstream *this_00;
  Functions *gl;
  glReadPixelsFunc p_Var1;
  bool bVar2;
  int iVar3;
  GLenum GVar4;
  ObjectTraits *pOVar5;
  undefined8 *puVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar11;
  undefined1 auVar10 [16];
  RGBA threshold8;
  Surface refSurface;
  Surface screen;
  Renderbuffer renderbuffer;
  Framebuffer framebuffer;
  IVec4 bitDepth;
  RGBA local_23c;
  TextureFormat local_238;
  TextureFormat local_230;
  Surface local_228;
  Surface local_210;
  ObjectWrapper local_1f8;
  ObjectWrapper local_1e0;
  int local_1c8;
  int iStack_1c4;
  int iStack_1c0;
  int iStack_1bc;
  undefined1 local_1b0 [32];
  void *local_190;
  ios_base local_138 [264];
  
  gl = api->m_gl;
  tcu::getTextureFormatMantissaBitDepth((tcu *)&local_1c8,(TextureFormat *)reference);
  auVar10._0_4_ = (int)(float)((8 - local_1c8) * 0x800000 + 0x3f800000);
  auVar10._4_4_ = (int)(float)((8 - iStack_1c4) * 0x800000 + 0x3f800000);
  auVar10._8_4_ = (int)(float)((8 - iStack_1c0) * 0x800000 + 0x3f800000);
  auVar10._12_4_ = (int)(float)((8 - iStack_1bc) * 0x800000 + 0x3f800000);
  uVar8 = auVar10._4_4_ * 2;
  uVar7 = auVar10._0_4_ * 2;
  if (0xfe < (int)uVar7) {
    uVar7 = 0xff;
  }
  uVar9 = 0;
  if ((int)uVar7 < 1) {
    uVar7 = uVar9;
  }
  if (0xfe < (int)uVar8) {
    uVar8 = 0xff;
  }
  if ((int)uVar8 < 1) {
    uVar8 = uVar9;
  }
  uVar11 = (uint)((auVar10._8_8_ & 0xffffffff) * 2);
  if (0xfe < (int)uVar11) {
    uVar11 = 0xff;
  }
  if ((int)uVar11 < 1) {
    uVar11 = uVar9;
  }
  iVar3 = 0xff;
  if (auVar10._12_4_ * 2 < 0xff) {
    iVar3 = auVar10._12_4_ * 2;
  }
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  local_23c.m_value = uVar11 << 0x10 | uVar8 << 8 | uVar7 | iVar3 << 0x18;
  local_230 = (TextureFormat)(api->super_CallLogWrapper).m_log;
  pOVar5 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_1e0,gl,pOVar5);
  pOVar5 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_1f8,gl,pOVar5);
  tcu::Surface::Surface(&local_210,reference->m_width,reference->m_height);
  tcu::Surface::Surface(&local_228,reference->m_width,reference->m_height);
  if (2 < (reference->super_TextureLevelPyramid).m_format.order - D) {
    this_00 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_4_ = local_230.order;
    local_1b0._4_4_ = local_230.type;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Reading with ReadPixels from renderbuffer",0x29);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
    (*gl->bindFramebuffer)(0x8d40,local_1e0.m_object);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"bindFramebuffer(GL_FRAMEBUFFER, *framebuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x2ca);
    (*gl->bindRenderbuffer)(0x8d41,local_1f8.m_object);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"bindRenderbuffer(GL_RENDERBUFFER, *renderbuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x2cb);
    imageTargetRenderbuffer
              ((api->super_ImageApi).m_egl,gl,
               ((img->super_UniqueBase<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>).
                m_data.ptr)->m_image);
    framebufferRenderbuffer(gl,0x8ce0,local_1f8.m_object);
    (*gl->viewport)(0,0,reference->m_width,reference->m_height);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"viewport(0, 0, reference.getWidth(), reference.getHeight())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x2cf);
    p_Var1 = gl->readPixels;
    local_238.order = RGBA;
    local_238.type = UNORM_INT8;
    if ((void *)local_210.m_pixels.m_cap != (void *)0x0) {
      local_210.m_pixels.m_cap = (size_t)local_210.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1b0,&local_238,local_210.m_width,local_210.m_height,1,
               (void *)local_210.m_pixels.m_cap);
    (*p_Var1)(0,0,local_210.m_width,local_210.m_height,0x1908,0x1401,local_190);
    (*gl->bindFramebuffer)(0x8d40,0);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"bindFramebuffer(GL_FRAMEBUFFER, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x2d3);
    (*gl->bindRenderbuffer)(0x8d41,0);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"bindRenderbuffer(GL_RENDERBUFFER, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x2d4);
    (*gl->finish)();
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"finish()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x2d5);
    local_238.order = RGBA;
    local_238.type = UNORM_INT8;
    if ((void *)local_228.m_pixels.m_cap != (void *)0x0) {
      local_228.m_pixels.m_cap = (size_t)local_228.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1b0,&local_238,local_228.m_width,local_228.m_height,1,
               (void *)local_228.m_pixels.m_cap);
    tcu::copy((EVP_PKEY_CTX *)local_1b0,
              (EVP_PKEY_CTX *)
              (reference->super_TextureLevelPyramid).m_access.
              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
              _M_impl.super__Vector_impl_data._M_start);
    bVar2 = tcu::pixelThresholdCompare
                      ((TestLog *)local_230,"Renderbuffer read","Result from reading renderbuffer",
                       &local_228,&local_210,&local_23c,COMPARE_LOG_RESULT);
    tcu::Surface::~Surface(&local_228);
    tcu::Surface::~Surface(&local_210);
    glu::ObjectWrapper::~ObjectWrapper(&local_1f8);
    glu::ObjectWrapper::~ObjectWrapper(&local_1e0);
    return bVar2;
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = &PTR__exception_02120f78;
  __cxa_throw(puVar6,&IllegalRendererException::typeinfo,std::exception::~exception);
}

Assistant:

bool GLES2ImageApi::RenderReadPixelsRenderbuffer::invokeGLES2 (GLES2ImageApi& api, MovePtr<UniqueImage>& img, tcu::Texture2D& reference) const
{
	const glw::Functions&	gl				= api.m_gl;
	const tcu::IVec4		bitDepth		= tcu::getTextureFormatMantissaBitDepth(reference.getFormat());
	const tcu::IVec4		threshold		(2 * (tcu::IVec4(1) << (tcu::IVec4(8) - bitDepth)));
	const tcu::RGBA			threshold8		((deUint8)(de::clamp(threshold[0], 0, 255)), (deUint8)(de::clamp(threshold[1], 0, 255)), (deUint8)(de::clamp(threshold[2], 0, 255)), (deUint8)(de::clamp(threshold[3], 0, 255)));
	tcu::TestLog&			log				= api.getLog();
	Framebuffer				framebuffer		(gl);
	Renderbuffer			renderbuffer	(gl);
	tcu::Surface			screen			(reference.getWidth(), reference.getHeight());
	tcu::Surface			refSurface		(reference.getWidth(), reference.getHeight());

	// Branch only taken in TryAll case
	if (reference.getFormat().order == tcu::TextureFormat::DS || reference.getFormat().order == tcu::TextureFormat::D)
		throw IllegalRendererException(); // Skip, GLES2 does not support ReadPixels for depth attachments
	if (reference.getFormat().order == tcu::TextureFormat::S)
		throw IllegalRendererException(); // Skip, GLES2 does not support ReadPixels for stencil attachments

	log << tcu::TestLog::Message << "Reading with ReadPixels from renderbuffer" << tcu::TestLog::EndMessage;

	GLU_CHECK_GLW_CALL(gl, bindFramebuffer(GL_FRAMEBUFFER, *framebuffer));
	GLU_CHECK_GLW_CALL(gl, bindRenderbuffer(GL_RENDERBUFFER, *renderbuffer));
	imageTargetRenderbuffer(api.m_egl, gl, **img);
	framebufferRenderbuffer(gl, GL_COLOR_ATTACHMENT0, *renderbuffer);

	GLU_CHECK_GLW_CALL(gl, viewport(0, 0, reference.getWidth(), reference.getHeight()));

	gl.readPixels(0, 0, screen.getWidth(), screen.getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, screen.getAccess().getDataPtr());

	GLU_CHECK_GLW_CALL(gl, bindFramebuffer(GL_FRAMEBUFFER, 0));
	GLU_CHECK_GLW_CALL(gl, bindRenderbuffer(GL_RENDERBUFFER, 0));
	GLU_CHECK_GLW_CALL(gl, finish());

	tcu::copy(refSurface.getAccess(), reference.getLevel(0));

	return tcu::pixelThresholdCompare(log, "Renderbuffer read", "Result from reading renderbuffer", refSurface, screen, threshold8, tcu::COMPARE_LOG_RESULT);

}